

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createLifetimeEnd(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *pPVar1;
  PointerGraph *in_RSI;
  User *in_RDI;
  PSNode *op1;
  uint in_stack_ffffffffffffffdc;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffe8;
  
  llvm::User::getOperand(in_RDI,in_stack_ffffffffffffffdc);
  pPVar1 = getOperand(in_stack_ffffffffffffffe8,(Value *)in_RDI);
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)17,dg::pta::PSNode*&>(in_RSI,(PSNode **)pPVar1)
  ;
  return pPVar1;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createLifetimeEnd(const llvm::Instruction *Inst) {
    PSNode *op1 = getOperand(Inst->getOperand(1));
    return PS.create<PSNodeType::INVALIDATE_OBJECT>(op1);
}